

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateSimpleNodeAnim
          (FBXConverter *this,string *name,Model *target,const_iterator *chain,
          const_iterator iter_end,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,
          double *min_time,bool reverse_order)

{
  pointer *pptVar1;
  undefined8 uVar2;
  PropertyTable *this_00;
  _Base_ptr p_Var3;
  undefined1 auVar4 [16];
  pointer plVar5;
  RotOrder RVar6;
  aiNodeAnim *na;
  Property *pPVar7;
  long lVar8;
  KeyFrameListList *pKVar9;
  KeyFrameListList *pKVar10;
  KeyFrameListList *pKVar11;
  KeyFrameListList *pKVar12;
  aiVectorKey *paVar13;
  aiVectorKey *out_translation;
  aiQuatKey *paVar14;
  undefined8 *puVar15;
  KeyFrameListList *pKVar16;
  LayerMap *pLVar17;
  float *pfVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  pointer_____offset_0x10___ *this_01;
  FBXConverter *pFVar21;
  FBXConverter *this_02;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined4 uVar26;
  float fVar27;
  aiQuaternion aVar28;
  KeyFrameListList local_118;
  KeyFrameListList joined;
  undefined1 local_d8 [8];
  _Base_ptr p_Stack_d0;
  _Base_ptr local_c8;
  FBXConverter *local_c0;
  KeyTimeList local_b8;
  undefined1 local_98 [8];
  _Base_ptr p_Stack_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  FBXConverter *local_78;
  aiNodeAnim *local_70;
  pointer local_68;
  float local_60;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  float local_40;
  aiNodeAnim *local_38;
  
  pKVar9 = &local_118;
  pKVar11 = &local_118;
  pKVar12 = &local_118;
  pKVar10 = &local_118;
  pKVar16 = &local_118;
  pLVar17 = (LayerMap *)chain;
  local_c0 = (FBXConverter *)target;
  local_78 = this;
  na = (aiNodeAnim *)operator_new(0x438);
  (na->mNodeName).length = 0;
  (na->mNodeName).data[0] = '\0';
  memset((na->mNodeName).data + 1,0x1b,0x3ff);
  na->mRotationKeys = (aiQuatKey *)0x0;
  na->mNumScalingKeys = 0;
  *(undefined8 *)&na->mNumPositionKeys = 0;
  *(undefined8 *)((long)&na->mPositionKeys + 4) = 0;
  na->mScalingKeys = (aiVectorKey *)0x0;
  na->mPreState = aiAnimBehaviour_DEFAULT;
  na->mPostState = aiAnimBehaviour_DEFAULT;
  uVar25 = name->_M_string_length;
  local_38 = na;
  if (uVar25 < 0x400) {
    (na->mNodeName).length = (ai_uint32)uVar25;
    memcpy((na->mNodeName).data,(name->_M_dataplus)._M_p,uVar25);
    (na->mNodeName).data[uVar25] = '\0';
  }
  pFVar21 = local_78;
  this_00 = (PropertyTable *)
            (local_c0->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (this_00 == (PropertyTable *)0x0) {
    __assert_fail("props.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXDocument.h"
                  ,0x1b4,"const PropertyTable &Assimp::FBX::Model::Props() const");
  }
  if (reverse_order) {
    pptVar1 = &joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Scaling","");
    local_118.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    local_d8._0_4_ = 0x3f800000;
    pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
    if (pPVar7 == (Property *)0x0) {
      local_40 = 1.0;
    }
    else {
      lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                             0);
      pKVar9 = &local_118;
      if (lVar8 != 0) {
        pKVar9 = (KeyFrameListList *)(lVar8 + 8);
      }
      pfVar18 = (float *)local_d8;
      if (lVar8 != 0) {
        pfVar18 = (float *)(lVar8 + 0x10);
      }
      local_40 = *pfVar18;
    }
    local_48 = *(_Base_ptr *)pKVar9;
    if (joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
      operator_delete(joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Translation","");
    local_118.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
    pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
    if (pPVar7 == (Property *)0x0) {
      local_58._8_4_ = 0.0;
    }
    else {
      lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                             0);
      pKVar11 = &local_118;
      if (lVar8 != 0) {
        pKVar11 = (KeyFrameListList *)(lVar8 + 8);
      }
      pfVar18 = (float *)local_d8;
      if (lVar8 != 0) {
        pfVar18 = (float *)(lVar8 + 0x10);
      }
      local_58._8_4_ = *pfVar18;
    }
    local_58._0_8_ = *(undefined8 *)pKVar11;
    if (joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
      operator_delete(joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Rotation","");
    local_118.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
    this_01 = (pointer_____offset_0x10___ *)&joined;
    pPVar7 = PropertyTable::Get(this_00,(string *)this_01);
    if (pPVar7 == (Property *)0x0) {
      local_60 = 0.0;
    }
    else {
      this_01 = &Property::typeinfo;
      lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,
                             0);
      pKVar12 = &local_118;
      if (lVar8 != 0) {
        pKVar12 = (KeyFrameListList *)(lVar8 + 8);
      }
      pfVar18 = (float *)local_d8;
      if (lVar8 != 0) {
        pfVar18 = (float *)(lVar8 + 0x10);
      }
      local_60 = *pfVar18;
    }
    local_68 = *(pointer *)pKVar12;
    if (joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
      operator_delete(joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_118.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8 = (_Base_ptr)0x0;
    local_d8 = (undefined1  [8])0x0;
    p_Stack_d0 = (_Base_ptr)0x0;
    local_88 = (_Base_ptr)0x0;
    local_98 = (undefined1  [8])0x0;
    p_Stack_90 = (_Base_ptr)0x0;
    if (chain[0xc]._M_node != iter_end._M_node) {
      GetKeyframeList((KeyFrameListList *)&local_b8,(FBXConverter *)this_01,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[0xc]._M_node + 2),start,stop);
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_118.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_118.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_118.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&local_b8);
    }
    if (chain[3]._M_node != iter_end._M_node) {
      GetKeyframeList((KeyFrameListList *)&local_b8,(FBXConverter *)this_01,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[3]._M_node + 2),start,stop);
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_d0;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8;
      local_c8 = (_Base_ptr)
                 local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_d8 = (undefined1  [8])
                 local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      p_Stack_d0 = (_Base_ptr)
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&local_b8);
    }
    if (chain[7]._M_node != iter_end._M_node) {
      GetKeyframeList((KeyFrameListList *)&local_b8,(FBXConverter *)this_01,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[7]._M_node + 2),start,stop);
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_88;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_90;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
      local_88 = (_Base_ptr)
                 local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_98 = (undefined1  [8])
                 local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      p_Stack_90 = (_Base_ptr)
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&local_b8);
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,0,
               local_118.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_118.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,
               joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,local_d8,p_Stack_d0);
    pFVar21 = (FBXConverter *)
              joined.
              super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,
               joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,local_98,p_Stack_90);
    local_70 = na;
    GetKeyTimeList(&local_b8,pFVar21,&joined);
    plVar5 = local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    p_Var20 = (_Base_ptr)
              local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar23 = (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar24 = (long)uVar23 >> 3;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar24;
    uVar25 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar25 = SUB168(auVar4 * ZEXT816(0x18),0);
    }
    local_80 = (_Base_ptr)operator_new__(uVar25);
    if ((_Base_ptr)plVar5 != p_Var20) {
      p_Var19 = local_80;
      do {
        *(undefined8 *)p_Var19 = 0;
        *(float *)&p_Var19->_M_parent = 1.0;
        *(float *)((long)&p_Var19->_M_parent + 4) = 0.0;
        p_Var19->_M_left = (_Base_ptr)0x0;
        p_Var19 = (_Base_ptr)&p_Var19->_M_right;
      } while (p_Var19 != (_Base_ptr)((long)&local_80->_M_color + uVar24 * 3 * 8));
    }
    paVar13 = (aiVectorKey *)operator_new__(uVar25);
    if ((_Base_ptr)plVar5 != p_Var20) {
      lVar8 = 0;
      do {
        puVar15 = (undefined8 *)((long)&paVar13->mTime + lVar8);
        *puVar15 = 0;
        puVar15[1] = 0;
        *(undefined4 *)((long)&(paVar13->mValue).z + lVar8) = 0;
        lVar8 = lVar8 + 0x18;
      } while (uVar24 * 0x18 != lVar8);
    }
    out_translation = (aiVectorKey *)operator_new__(uVar25);
    if ((_Base_ptr)plVar5 != p_Var20) {
      lVar8 = 0;
      do {
        puVar15 = (undefined8 *)((long)&out_translation->mTime + lVar8);
        *puVar15 = 0;
        puVar15[1] = 0;
        *(undefined4 *)((long)&(out_translation->mValue).z + lVar8) = 0;
        lVar8 = lVar8 + 0x18;
      } while (uVar24 * 0x18 != lVar8);
      RVar6 = Model::RotationOrder((Model *)local_c0);
      ConvertTransformOrder_TRStoSRT
                (local_78,(aiQuatKey *)local_80,paVar13,out_translation,&local_118,
                 (KeyFrameListList *)local_d8,(KeyFrameListList *)local_98,&local_b8,max_time,
                 min_time,RVar6,(aiVector3D *)&local_48,(aiVector3D *)local_58,
                 (aiVector3D *)&local_68);
      uVar23 = (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      p_Var20 = (_Base_ptr)
                local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    na = local_70;
    uVar22 = (uint)(uVar23 >> 3);
    local_70->mNumScalingKeys = uVar22;
    local_70->mNumRotationKeys = uVar22;
    local_70->mNumPositionKeys = uVar22;
    local_70->mScalingKeys = paVar13;
    local_70->mRotationKeys = (aiQuatKey *)local_80;
    local_70->mPositionKeys = out_translation;
    if (p_Var20 != (_Base_ptr)0x0) {
      operator_delete(p_Var20);
    }
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&joined);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)local_98);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)local_d8);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&local_118);
  }
  else {
    if (chain[0xc]._M_node == iter_end._M_node) {
      paVar13 = (aiVectorKey *)operator_new__(0x18);
      pLVar17 = (LayerMap *)0x0;
      (paVar13->mValue).x = 0.0;
      (paVar13->mValue).y = 0.0;
      (paVar13->mValue).z = 0.0;
      na->mScalingKeys = paVar13;
      na->mNumScalingKeys = 1;
      paVar13->mTime = 0.0;
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Scaling","");
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
      local_d8._0_4_ = 0x3f800000;
      pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar7 == (Property *)0x0) {
        fVar27 = 1.0;
      }
      else {
        lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                               &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pKVar10 = &local_118;
        if (lVar8 != 0) {
          pKVar10 = (KeyFrameListList *)(lVar8 + 8);
        }
        pLVar17 = (LayerMap *)local_d8;
        if (lVar8 != 0) {
          pLVar17 = (LayerMap *)(lVar8 + 0x10);
        }
        fVar27 = *(float *)&(pLVar17->_M_t)._M_impl;
      }
      uVar2 = *(undefined8 *)pKVar10;
      paVar13 = na->mScalingKeys;
      (paVar13->mValue).x = (float)(int)uVar2;
      (paVar13->mValue).y = (float)(int)((ulong)uVar2 >> 0x20);
      (paVar13->mValue).z = fVar27;
      pFVar21 = local_78;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        pFVar21 = local_78;
      }
    }
    else {
      ConvertScaleKeys(local_78,na,
                       (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                        *)(chain[0xc]._M_node + 2),pLVar17,start,stop,max_time,min_time);
    }
    p_Var3 = chain[7]._M_node;
    if (p_Var3 == iter_end._M_node) {
      paVar14 = (aiQuatKey *)operator_new__(0x18);
      (paVar14->mValue).w = 1.0;
      (paVar14->mValue).x = 0.0;
      (paVar14->mValue).y = 0.0;
      (paVar14->mValue).z = 0.0;
      na->mRotationKeys = paVar14;
      na->mNumRotationKeys = 1;
      paVar14->mTime = 0.0;
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Rotation","");
      local_d8 = (undefined1  [8])0x0;
      local_98 = (undefined1  [8])((ulong)(uint)local_98._4_4_ << 0x20);
      pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar7 == (Property *)0x0) {
        puVar15 = (undefined8 *)local_d8;
        uVar26 = 0;
      }
      else {
        lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                               &TypedProperty<aiVector3t<float>>::typeinfo,0);
        puVar15 = (undefined8 *)local_d8;
        if (lVar8 != 0) {
          puVar15 = (undefined8 *)(lVar8 + 8);
        }
        pLVar17 = (LayerMap *)local_98;
        if (lVar8 != 0) {
          pLVar17 = (LayerMap *)(lVar8 + 0x10);
        }
        uVar26 = *(undefined4 *)&(pLVar17->_M_t)._M_impl;
      }
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar15;
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_118.
                             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,uVar26);
      this_02 = local_c0;
      RVar6 = Model::RotationOrder((Model *)local_c0);
      aVar28 = EulerToQuaternion(this_02,(aiVector3D *)&local_118,RVar6);
      na->mRotationKeys->mValue = aVar28;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      RVar6 = Model::RotationOrder((Model *)local_c0);
      ConvertRotationKeys(pFVar21,na,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)(p_Var3 + 2),pLVar17,start,stop,max_time,min_time,RVar6);
    }
    if (chain[3]._M_node == iter_end._M_node) {
      paVar13 = (aiVectorKey *)operator_new__(0x18);
      (paVar13->mValue).x = 0.0;
      (paVar13->mValue).y = 0.0;
      (paVar13->mValue).z = 0.0;
      na->mPositionKeys = paVar13;
      na->mNumPositionKeys = 1;
      paVar13->mTime = 0.0;
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Translation","");
      local_118.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
      pPVar7 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar7 == (Property *)0x0) {
        fVar27 = 0.0;
      }
      else {
        lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                               &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pKVar16 = &local_118;
        if (lVar8 != 0) {
          pKVar16 = (KeyFrameListList *)(lVar8 + 8);
        }
        pfVar18 = (float *)local_d8;
        if (lVar8 != 0) {
          pfVar18 = (float *)(lVar8 + 0x10);
        }
        fVar27 = *pfVar18;
      }
      uVar2 = *(undefined8 *)pKVar16;
      paVar13 = na->mPositionKeys;
      (paVar13->mValue).x = (float)(int)uVar2;
      (paVar13->mValue).y = (float)(int)((ulong)uVar2 >> 0x20);
      (paVar13->mValue).z = fVar27;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      ConvertTranslationKeys
                (pFVar21,na,
                 (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  *)(chain[3]._M_node + 2),pLVar17,start,stop,max_time,min_time);
    }
  }
  return na;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateSimpleNodeAnim(const std::string& name,
            const Model& target,
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM],
            NodeMap::const_iterator iter_end,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool reverse_order)

        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            const PropertyTable& props = target.Props();

            // need to convert from TRS order to SRT?
            if (reverse_order) {

                aiVector3D def_scale = PropertyGet(props, "Lcl Scaling", aiVector3D(1.f, 1.f, 1.f));
                aiVector3D def_translate = PropertyGet(props, "Lcl Translation", aiVector3D(0.f, 0.f, 0.f));
                aiVector3D def_rot = PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f));

                KeyFrameListList scaling;
                KeyFrameListList translation;
                KeyFrameListList rotation;

                if (chain[TransformationComp_Scaling] != iter_end) {
                    scaling = GetKeyframeList((*chain[TransformationComp_Scaling]).second, start, stop);
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    translation = GetKeyframeList((*chain[TransformationComp_Translation]).second, start, stop);
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    rotation = GetKeyframeList((*chain[TransformationComp_Rotation]).second, start, stop);
                }

                KeyFrameListList joined;
                joined.insert(joined.end(), scaling.begin(), scaling.end());
                joined.insert(joined.end(), translation.begin(), translation.end());
                joined.insert(joined.end(), rotation.begin(), rotation.end());

                const KeyTimeList& times = GetKeyTimeList(joined);

                aiQuatKey* out_quat = new aiQuatKey[times.size()];
                aiVectorKey* out_scale = new aiVectorKey[times.size()];
                aiVectorKey* out_translation = new aiVectorKey[times.size()];

                if (times.size())
                {
                    ConvertTransformOrder_TRStoSRT(out_quat, out_scale, out_translation,
                        scaling,
                        translation,
                        rotation,
                        times,
                        max_time,
                        min_time,
                        target.RotationOrder(),
                        def_scale,
                        def_translate,
                        def_rot);
                }

                // XXX remove duplicates / redundant keys which this operation did
                // likely produce if not all three channels were equally dense.

                na->mNumScalingKeys = static_cast<unsigned int>(times.size());
                na->mNumRotationKeys = na->mNumScalingKeys;
                na->mNumPositionKeys = na->mNumScalingKeys;

                na->mScalingKeys = out_scale;
                na->mRotationKeys = out_quat;
                na->mPositionKeys = out_translation;
            }
            else {

                // if a particular transformation is not given, grab it from
                // the corresponding node to meet the semantics of aiNodeAnim,
                // which requires all of rotation, scaling and translation
                // to be set.
                if (chain[TransformationComp_Scaling] != iter_end) {
                    ConvertScaleKeys(na.get(), (*chain[TransformationComp_Scaling]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mScalingKeys = new aiVectorKey[1];
                    na->mNumScalingKeys = 1;

                    na->mScalingKeys[0].mTime = 0.;
                    na->mScalingKeys[0].mValue = PropertyGet(props, "Lcl Scaling",
                        aiVector3D(1.f, 1.f, 1.f));
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    ConvertRotationKeys(na.get(), (*chain[TransformationComp_Rotation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time,
                        target.RotationOrder());
                }
                else {
                    na->mRotationKeys = new aiQuatKey[1];
                    na->mNumRotationKeys = 1;

                    na->mRotationKeys[0].mTime = 0.;
                    na->mRotationKeys[0].mValue = EulerToQuaternion(
                        PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f)),
                        target.RotationOrder());
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    ConvertTranslationKeys(na.get(), (*chain[TransformationComp_Translation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mPositionKeys = new aiVectorKey[1];
                    na->mNumPositionKeys = 1;

                    na->mPositionKeys[0].mTime = 0.;
                    na->mPositionKeys[0].mValue = PropertyGet(props, "Lcl Translation",
                        aiVector3D(0.f, 0.f, 0.f));
                }

            }
            return na.release();
        }